

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void SolveLDLT(Matrix *l,Matrix *d,Matrix *b)

{
  ostream *poVar1;
  Matrix local_438;
  undefined1 local_418 [8];
  LinearSystem solver;
  Matrix y;
  LinearSystem y_solver;
  Matrix z;
  undefined1 local_158 [8];
  LinearSystem z_solver;
  Matrix *b_local;
  Matrix *d_local;
  Matrix *l_local;
  
  z_solver.history_.
  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)b;
  LinearSystem::LinearSystem((LinearSystem *)local_158,l,b,Standard);
  LinearSystem::RunGauss((LinearSystem *)local_158,Without);
  poVar1 = operator<<((ostream *)Options::writer_abi_cxx11_,(LinearSystem *)local_158);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  LinearSystem::GetSolutionMatrix
            ((Matrix *)
             &y_solver.history_.
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(LinearSystem *)local_158);
  LinearSystem::LinearSystem
            ((LinearSystem *)
             &y.elements_.
              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,d,
             (Matrix *)
             &y_solver.history_.
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Standard);
  LinearSystem::RunGauss
            ((LinearSystem *)
             &y.elements_.
              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,Without);
  poVar1 = operator<<((ostream *)Options::writer_abi_cxx11_,
                      (LinearSystem *)
                      &y.elements_.
                       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  LinearSystem::GetSolutionMatrix
            ((Matrix *)
             &solver.history_.
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (LinearSystem *)
             &y.elements_.
              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Matrix::GetTranspose(&local_438,l);
  LinearSystem::LinearSystem
            ((LinearSystem *)local_418,&local_438,
             (Matrix *)
             &solver.history_.
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,Standard);
  Matrix::~Matrix(&local_438);
  LinearSystem::RunGauss((LinearSystem *)local_418,Without);
  poVar1 = operator<<((ostream *)Options::writer_abi_cxx11_,(LinearSystem *)local_418);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  LinearSystem::~LinearSystem((LinearSystem *)local_418);
  Matrix::~Matrix((Matrix *)
                  &solver.history_.
                   super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  LinearSystem::~LinearSystem
            ((LinearSystem *)
             &y.elements_.
              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Matrix::~Matrix((Matrix *)
                  &y_solver.history_.
                   super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  LinearSystem::~LinearSystem((LinearSystem *)local_158);
  return;
}

Assistant:

void SolveLDLT(const Matrix& l, const Matrix& d, const Matrix& b) {
    LinearSystem z_solver(l, b);
    z_solver.RunGauss(Options::ChoiceType::Without);
    Options::writer << z_solver << std::endl;
    Matrix z = z_solver.GetSolutionMatrix();

    LinearSystem y_solver(d, z);
    y_solver.RunGauss(Options::ChoiceType::Without);
    Options::writer << y_solver << std::endl;
    Matrix y = y_solver.GetSolutionMatrix();

    LinearSystem solver(l.GetTranspose(), y);
    solver.RunGauss(Options::ChoiceType::Without);
    Options::writer << solver << std::endl;
}